

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghsymbol.cc
# Opt level: O2

void __thiscall DecisionNode::orderPatterns(DecisionNode *this,DecisionProperties *props)

{
  DisjointPattern *pDVar1;
  DisjointPattern *pDVar2;
  Constructor *pCVar3;
  Constructor *b;
  DisjointPattern *this_00;
  Constructor *pCVar4;
  pointer ppVar5;
  undefined8 *puVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  long local_98;
  vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
  newlist;
  pair<DisjointPattern_*,_Constructor_*> local_68;
  vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
  conflictlist;
  
  newlist.
  super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  newlist.
  super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  newlist.
  super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  conflictlist.
  super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  conflictlist.
  super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  conflictlist.
  super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (uVar7 = 0;
      uVar7 < (ulong)((long)(this->list).
                            super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->list).
                            super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4); uVar7 = uVar7 + 1) {
    lVar8 = 0;
    uVar9 = uVar7;
    while (bVar11 = uVar9 != 0, uVar9 = uVar9 - 1, bVar11) {
      ppVar5 = (this->list).
               super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      bVar11 = DisjointPattern::identical
                         (ppVar5[uVar7].first,*(DisjointPattern **)((long)&ppVar5->first + lVar8));
      if (bVar11) {
        ppVar5 = (this->list).
                 super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        DecisionProperties::identicalPattern
                  (props,ppVar5[uVar7].second,*(Constructor **)((long)&ppVar5->second + lVar8));
      }
      lVar8 = lVar8 + 0x10;
    }
  }
  std::
  vector<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
  ::operator=(&newlist,&this->list);
  ppVar5 = (this->list).
           super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_98 = 0;
  uVar7 = 0;
  do {
    if ((ulong)((long)(this->list).
                      super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar5 >> 4) <= uVar7) {
      uVar7 = 0;
      do {
        if ((ulong)((long)conflictlist.
                          super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)conflictlist.
                          super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar7) {
          std::
          _Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
          ::~_Vector_base(&conflictlist.
                           super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                         );
          std::
          _Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
          ::~_Vector_base(&newlist.
                           super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                         );
          return;
        }
        pDVar1 = conflictlist.
                 super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar7].first;
        pCVar3 = conflictlist.
                 super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar7].second;
        pDVar2 = conflictlist.
                 super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar7 + 1].first;
        b = conflictlist.
            super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar7 + 1].second;
        lVar8 = 8;
        uVar9 = 0xffffffffffffffff;
        do {
          ppVar5 = (this->list).
                   super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar9 = uVar9 + 1;
          if ((ulong)((long)(this->list).
                            super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar5 >> 4) <= uVar9
             ) {
LAB_00344e07:
            DecisionProperties::conflictingPattern(props,pCVar3,b);
            break;
          }
          this_00 = *(DisjointPattern **)((long)ppVar5 + lVar8 + -8);
          pCVar4 = *(Constructor **)((long)&ppVar5->first + lVar8);
          if (((this_00 == pDVar1) && (pCVar4 == pCVar3)) || ((this_00 == pDVar2 && (pCVar4 == b))))
          goto LAB_00344e07;
          bVar11 = DisjointPattern::resolvesIntersect(this_00,pDVar1,pDVar2);
          lVar8 = lVar8 + 0x10;
        } while (!bVar11);
        uVar7 = uVar7 + 2;
      } while( true );
    }
    lVar8 = 0;
    for (uVar9 = 0;
        ppVar5 = (this->list).
                 super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start, uVar10 = uVar7, uVar7 != uVar9;
        uVar9 = uVar9 + 1) {
      pDVar1 = newlist.
               super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar7].first;
      pDVar2 = *(DisjointPattern **)((long)&ppVar5->first + lVar8);
      bVar11 = DisjointPattern::specializes(pDVar1,pDVar2);
      if (bVar11) {
        ppVar5 = (this->list).
                 super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        uVar10 = uVar9;
        break;
      }
      bVar11 = DisjointPattern::specializes(pDVar2,pDVar1);
      if (!bVar11) {
        pCVar3 = *(Constructor **)
                  ((long)&((this->list).
                           super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->second + lVar8);
        if (newlist.
            super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar7].second != pCVar3) {
          local_68.first = pDVar1;
          local_68.second =
               newlist.
               super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar7].second;
          std::
          vector<std::pair<DisjointPattern*,Constructor*>,std::allocator<std::pair<DisjointPattern*,Constructor*>>>
          ::emplace_back<std::pair<DisjointPattern*,Constructor*>>
                    ((vector<std::pair<DisjointPattern*,Constructor*>,std::allocator<std::pair<DisjointPattern*,Constructor*>>>
                      *)&conflictlist,&local_68);
          local_68.first = pDVar2;
          local_68.second = pCVar3;
          std::
          vector<std::pair<DisjointPattern*,Constructor*>,std::allocator<std::pair<DisjointPattern*,Constructor*>>>
          ::emplace_back<std::pair<DisjointPattern*,Constructor*>>
                    ((vector<std::pair<DisjointPattern*,Constructor*>,std::allocator<std::pair<DisjointPattern*,Constructor*>>>
                      *)&conflictlist,&local_68);
        }
      }
      lVar8 = lVar8 + 0x10;
    }
    puVar6 = (undefined8 *)((long)&ppVar5->first + local_98);
    for (uVar9 = uVar7; (long)(int)uVar10 < (long)uVar9; uVar9 = uVar9 - 1) {
      *puVar6 = puVar6[-2];
      puVar6[1] = puVar6[-1];
      puVar6 = puVar6 + -2;
    }
    pCVar3 = newlist.
             super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar7].second;
    ppVar5[uVar10 & 0xffffffff].first =
         newlist.
         super__Vector_base<std::pair<DisjointPattern_*,_Constructor_*>,_std::allocator<std::pair<DisjointPattern_*,_Constructor_*>_>_>
         ._M_impl.super__Vector_impl_data._M_start[uVar7].first;
    ppVar5[uVar10 & 0xffffffff].second = pCVar3;
    uVar7 = uVar7 + 1;
    local_98 = local_98 + 0x10;
  } while( true );
}

Assistant:

void DecisionNode::orderPatterns(DecisionProperties &props)

{
  // This is a tricky routine.  When this routine is called, the patterns remaining in the
  // the decision node can no longer be distinguished by examining additional bits. The basic
  // idea here is that the patterns should be ordered so that the most specialized should come
  // first in the list. Pattern 1 is a specialization of pattern 2, if the set of instructions
  // matching 1 is contained in the set matching 2.  So in the simplest case, the pattern order
  // should represent a strict nesting.  Unfortunately, there are many potential situations where
  // patterns don't necessarily nest.
  //   1) An "or" of two patterns.  This can be an explicit '|' operator in the Constructor, in
  //      which case this can be detected because the two patterns point to the same constructor
  //      But the "or" can be implied across two constructors that do the same thing.  This should
  //      probably be flagged as an error except in the following case.
  //   2) Two patterns aren't properly nested, but they are "resolved" by a third pattern which
  //      covers the intersection of the first two patterns.  Sometimes its easier to specify
  //      three cases that need to be distinguished in this way.
  //   3) Recursive constructors that use a "guard" context bit.  The guard bit is used to prevent
  //      the recursive constructor from matching repeatedly, but it's too much work to put a
  //      constraint an the bit for every other pattern.
  //   4) Other situations where the ability to distinguish between constructors is hidden in
  //      the subconstructors.
  // This routine can determine if an intersection results from case 1) or case 2)
  int4 i,j,k;
  vector<pair<DisjointPattern *,Constructor *> > newlist;
  vector<pair<DisjointPattern *,Constructor *> > conflictlist;

  // Check for identical patterns
  for(i=0;i<list.size();++i) {
    for(j=0;j<i;++j) {
      DisjointPattern *ipat = list[i].first;
      DisjointPattern *jpat = list[j].first;
      if (ipat->identical(jpat))
	props.identicalPattern(list[i].second,list[j].second);
    }
  }

  newlist = list;
  for(i=0;i<list.size();++i) {
    for(j=0;j<i;++j) {
      DisjointPattern *ipat = newlist[i].first;
      DisjointPattern *jpat = list[j].first;
      if (ipat->specializes(jpat))
	break;
      if (!jpat->specializes(ipat)) { // We have a potential conflict
	Constructor *iconst = newlist[i].second;
	Constructor *jconst = list[j].second;
	if (iconst == jconst) { // This is an OR in the pattern for ONE constructor
	  // So there is no conflict
	}
	else {			// A true conflict that needs to be resolved
	  conflictlist.push_back(pair<DisjointPattern *,Constructor *>(ipat,iconst));
	  conflictlist.push_back(pair<DisjointPattern *,Constructor *>(jpat,jconst));
	}
      }
    }
    for(k=i-1;k>=j;--k)
      list[k+1] = list[k];
    list[j] = newlist[i];
  }
  
  // Check if intersection patterns are present, which resolve conflicts
  for(i=0;i<conflictlist.size();i+=2) {
    DisjointPattern *pat1,*pat2;
    Constructor *const1,*const2;
    pat1 = conflictlist[i].first;
    const1 = conflictlist[i].second;
    pat2 = conflictlist[i+1].first;
    const2 = conflictlist[i+1].second;
    bool resolved = false;
    for(j=0;j<list.size();++j) {
      DisjointPattern *tpat = list[j].first;
      Constructor *tconst = list[j].second;
      if ((tpat == pat1)&&(tconst==const1)) break; // Ran out of possible specializations
      if ((tpat == pat2)&&(tconst==const2)) break;
      if (tpat->resolvesIntersect(pat1,pat2)) {
	resolved = true;
	break;
      }
    }
    if (!resolved)
      props.conflictingPattern(const1,const2);
  }
}